

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

reentrant_put_transaction<Func> * __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
::
start_reentrant_emplace<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_reentrant_put_samples(std::ostream&)::Func,density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_reentrant_put_samples(std::ostream&)::Func>
          (reentrant_put_transaction<Func> *__return_storage_ptr__,
          lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>
          *this,Func_conflict *i_construction_params)

{
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *pFVar1;
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> FVar2;
  reentrant_put_transaction<Func> local_68;
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *local_48;
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *type_storage;
  runtime_type *type;
  Allocation push_data;
  Func_conflict *i_construction_params_local;
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  *this_local;
  
  push_data.m_user_storage = i_construction_params;
  detail::
  LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::consistency_model)0>
  ::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0,1ul,true,16ul,8ul>
            ((Allocation *)&type,this);
  type_storage = (FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *)0x0;
  pFVar1 = detail::
           LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
           ::type_after_control((ControlBlock *)type);
  local_48 = pFVar1;
  FVar2 = detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>::make<Func>();
  *pFVar1 = FVar2;
  *(undefined8 *)push_data.m_next_ptr = *push_data.m_user_storage;
  *(undefined8 *)(push_data.m_next_ptr + 8) = *(undefined8 *)((long)push_data.m_user_storage + 8);
  type_storage = pFVar1;
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::reentrant_put_transaction<Func>::reentrant_put_transaction
            (&local_68,0,
             (lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
              *)this,(Allocation *)&type);
  reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_reentrant_put_samples(std::ostream&)::Func>
  ::
  reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_reentrant_put_samples(std::ostream&)::Func,void>
            ((reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,(density::consistency_model)0>::func_queue_reentrant_put_samples(std::ostream&)::Func>
              *)__return_storage_ptr__,&local_68);
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_68);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            auto push_data = Base::template try_inplace_allocate_impl<
              detail::LfQueue_Throwing,
              detail::LfQueue_Busy,
              true,
              detail::size_of<ELEMENT_TYPE>::value,
              alignof(ELEMENT_TYPE)>();

            runtime_type * type = nullptr;
            try
            {
                auto const type_storage = Base::type_after_control(push_data.m_control_block);
                DENSITY_ASSUME(type_storage != nullptr);
                type = new (type_storage) runtime_type(runtime_type::template make<ELEMENT_TYPE>());

                DENSITY_ASSUME(push_data.m_user_storage != nullptr);
                new (push_data.m_user_storage)
                  ELEMENT_TYPE(std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            }
            catch (...)
            {
                if (type != nullptr)
                    type->RUNTIME_TYPE::~RUNTIME_TYPE();
                Base::cancel_put_nodestroy_impl(push_data);
                throw;
            }

            return reentrant_put_transaction<ELEMENT_TYPE>(PrivateType(), this, push_data);
        }